

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_cube(rf_vec3 position,float width,float height,float length,rf_color color)

{
  _Bool _Var1;
  float z;
  float y;
  float x;
  float length_local;
  float height_local;
  float width_local;
  rf_color color_local;
  undefined4 local_14;
  undefined4 uStack_10;
  rf_vec3 position_local;
  
  _Var1 = rf_gfx_check_buffer_limit(0x24);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  local_14 = position.x;
  uStack_10 = position.y;
  rf_gfx_translatef(local_14,uStack_10,position.z);
  rf_gfx_begin(RF_TRIANGLES);
  height_local._0_1_ = color.r;
  height_local._1_1_ = color.g;
  height_local._2_1_ = color.b;
  height_local._3_1_ = color.a;
  rf_gfx_color4ub(height_local._0_1_,height_local._1_1_,height_local._2_1_,height_local._3_1_);
  rf_gfx_vertex3f(0.0 - width / 2.0,0.0 - height / 2.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,height / 2.0 + 0.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,height / 2.0 + 0.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,0.0 - height / 2.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,height / 2.0 + 0.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(width / 2.0 + 0.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,0.0 - length / 2.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,0.0 - height / 2.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,height / 2.0 + 0.0,length / 2.0 + 0.0);
  rf_gfx_vertex3f(0.0 - width / 2.0,0.0 - height / 2.0,0.0 - length / 2.0);
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_cube(rf_vec3 position, float width, float height, float length, rf_color color)
{
    float x = 0.0f;
    float y = 0.0f;
    float z = 0.0f;

    if (rf_gfx_check_buffer_limit(36)) rf_gfx_draw();

    rf_gfx_push_matrix();
    // NOTE: Transformation is applied in inverse order (scale -> rotate -> translate)
    rf_gfx_translatef(position.x, position.y, position.z);
    //rf_gfx_rotatef(45, 0, 1, 0);
    //rf_gfx_scalef(1.0f, 1.0f, 1.0f);   // NOTE: Vertices are directly scaled on definition

    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    // Front face
    rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left

    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right

    // Back face
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Left
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right

    rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right
    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left

    // Top face
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Bottom Left
    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Bottom Right

    rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Left
    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Bottom Right

    // Bottom face
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Top Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Left

    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Top Right
    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Top Left

    // Right face
    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_vertex3f(x + width/2, y + height/2, z - length/2); // Top Right
    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Left

    rf_gfx_vertex3f(x + width/2, y - height/2, z + length/2); // Bottom Left
    rf_gfx_vertex3f(x + width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_vertex3f(x + width/2, y + height/2, z + length/2); // Top Left

    // Left face
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left
    rf_gfx_vertex3f(x - width/2, y + height/2, z - length/2); // Top Right

    rf_gfx_vertex3f(x - width/2, y - height/2, z + length/2); // Bottom Left
    rf_gfx_vertex3f(x - width/2, y + height/2, z + length/2); // Top Left
    rf_gfx_vertex3f(x - width/2, y - height/2, z - length/2); // Bottom Right
    rf_gfx_end();
    rf_gfx_pop_matrix();
}